

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O2

node * __thiscall YAML::NodeBuilder::Push(NodeBuilder *this,Mark *mark,anchor_t anchor)

{
  node *this_00;
  
  this_00 = detail::memory_holder::create_node
                      ((this->m_pMemory).
                       super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  detail::node::set_mark(this_00,mark);
  RegisterAnchor(this,anchor,this_00);
  Push(this,this_00);
  return this_00;
}

Assistant:

detail::node& NodeBuilder::Push(const Mark& mark, anchor_t anchor) {
  detail::node& node = m_pMemory->create_node();
  node.set_mark(mark);
  RegisterAnchor(anchor, node);
  Push(node);
  return node;
}